

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O3

int pipScaleFromStr(string *value)

{
  int iVar1;
  int iVar2;
  string v;
  string local_48;
  string local_28;
  
  strToLowerCase(&local_28,value);
  trimStr(&local_48,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_48);
  iVar2 = 2;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_48);
      iVar2 = 3;
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)&local_48);
          if (iVar1 == 0) {
            iVar2 = 4;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)&local_48);
            iVar2 = (uint)(iVar1 == 0) * 4 + 1;
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

int pipScaleFromStr(const std::string& value)
{
    const std::string v = trimStr(strToLowerCase(value));

    if (v == "1/2" || v == "0.5")
        return 2;
    if (v == "1/4" || v == "0.25")
        return 3;
    if (v == "1.5")
        return 4;
    if (v == "fullscreen")
        return 5;

    return 1;  // default
}